

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

bool __thiscall helics::BrokerBase::getFlagValue(BrokerBase *this,int32_t flag)

{
  byte bVar1;
  
  if (flag == 0x58) {
    bVar1 = (((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->forceLoggingFlush)._M_base._M_i;
  }
  else if (flag == 0x59) {
    bVar1 = this->dumplog;
  }
  else {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool BrokerBase::getFlagValue(int32_t flag) const
{
    switch (flag) {
        case HELICS_FLAG_DUMPLOG:
            return dumplog;
        case HELICS_FLAG_FORCE_LOGGING_FLUSH:
            return mLogManager->forceLoggingFlush.load();
        default:
            return false;
    }
}